

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O3

void __thiscall
MemoryFile_ReadFileWithInitialContents_Test::TestBody
          (MemoryFile_ReadFileWithInitialContents_Test *this)

{
  _func_int **pp_Var1;
  size_t sVar2;
  _Alloc_hider *p_Var3;
  pointer *__ptr;
  long lVar4;
  char *pcVar5;
  char *in_R9;
  pointer *__ptr_2;
  buffer result;
  buffer out;
  size_t elements;
  char source_string [12];
  in_memory mf;
  size_t actual_read;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined1 local_a8 [8];
  _Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false> local_a0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_98;
  MemoryFile local_90;
  unsigned_long local_80;
  AssertHelper local_78;
  char local_70 [16];
  undefined1 local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  _func_int **local_40;
  AssertHelperData *local_30;
  not_null<void_*> local_28;
  size_t local_20;
  
  local_80 = 0xb;
  builtin_strncpy(local_70,"Hello World",0xc);
  local_c8 = (undefined1  [8])0xb;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_60,"elements","std::strlen (source_string)",&local_80,
             (unsigned_long *)local_c8);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_c8 + 0x10),"Expected buffer length to be ",0x1d);
    std::ostream::_M_insert<unsigned_long>((ulong)((long)local_c8 + 0x10));
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0x1ba,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_c8 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      return;
    }
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
    return;
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_c8 = (undefined1  [8])&local_b8;
  sVar2 = strlen(local_70);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,local_70,local_70 + sVar2);
  anon_unknown.dwarf_1431b::MemoryFile::make_buffer((MemoryFile *)local_a8,(size_t)local_c0);
  if (0 < (long)local_c0) {
    p_Var3 = (_Alloc_hider *)((long)&(local_c0->_M_dataplus)._M_p + 1);
    lVar4 = 0;
    do {
      *(char *)((long)(Type *)local_a8 + lVar4) = *(char *)((long)local_c8 + lVar4);
      p_Var3 = (_Alloc_hider *)((long)(p_Var3 + 0xffffffffffffffff) + 7);
      lVar4 = lVar4 + 1;
    } while ((_Alloc_hider *)0x1 < p_Var3);
  }
  local_90.super_Test._vptr_Test = (_func_int **)local_a8;
  local_90.super_Test.gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (__uniq_ptr_data<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>,_true,_true>
        )(__uniq_ptr_data<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>,_true,_true>
          )local_a0._M_head_impl;
  pstore::file::in_memory::in_memory
            ((in_memory *)local_60,(shared_ptr<void> *)&local_90,0xb,0xb,true);
  if (local_90.super_Test.gtest_flag_saver_._M_t.
      super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
      .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
       )0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_90.super_Test.gtest_flag_saver_._M_t.
               super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
               ._M_t.
               super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
               .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl);
  }
  if (local_c8 != (undefined1  [8])&local_b8) {
    operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
  }
  local_a8 = (undefined1  [8])((ulong)(uint)local_a8._4_4_ << 0x20);
  local_90.super_Test._vptr_Test = (_func_int **)local_30;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_c8,"0U","mf.tell ()",(uint *)local_a8,(unsigned_long *)&local_90);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_90.super_Test._vptr_Test + 0x10),
               "Expected the initial file offset to be 0",0x28);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0x1be,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if ((AssertHelperData *)local_90.super_Test._vptr_Test != (AssertHelperData *)0x0) {
      (**(code **)(*local_90.super_Test._vptr_Test + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_90.super_Test._vptr_Test = local_40;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_c8,"elements","mf.size ()",&local_80,(unsigned_long *)&local_90);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_90.super_Test._vptr_Test + 2),
               "Expected the file to be the same size as the string",0x33);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0x1bf,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if (local_90.super_Test._vptr_Test != (_func_int **)0x0) {
      (**(code **)(*local_90.super_Test._vptr_Test + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  anon_unknown.dwarf_1431b::MemoryFile::make_buffer(&local_90,0xb);
  pp_Var1 = local_90.super_Test._vptr_Test;
  local_28.ptr_ = local_90.super_Test._vptr_Test;
  pstore::gsl::not_null<void_*>::ensure_invariant(&local_28);
  local_20 = pstore::file::in_memory::read_buffer((in_memory *)local_60,local_28,0xb);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_c8,"elements","actual_read",&local_80,&local_20);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0x1c3,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_a8);
  }
  else {
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    lVar4 = 0;
    do {
      if ((uint)*(byte *)((long)pp_Var1 + lVar4) != (int)local_70[lVar4]) {
        local_a8 = (undefined1  [8])((ulong)local_a8 & 0xffffffffffffff00);
        local_a0._M_head_impl = (GTestFlagSaver *)0x0;
        testing::Message::Message((Message *)&local_98);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_c8,(internal *)local_a8,
                   (AssertionResult *)
                   "std::equal (out.get (), out.get () + elements, source_string)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                   ,0x1c4,(char *)local_c8);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if (local_c8 != (undefined1  [8])&local_b8) {
          operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
        }
        if (local_98._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_98._M_head_impl + 8))();
        }
        if (local_a0._M_head_impl != (GTestFlagSaver *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_a0._M_head_impl);
        }
        break;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0xb);
    local_a8 = (undefined1  [8])local_30;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_c8,"elements","mf.tell ()",&local_80,(unsigned_long *)local_a8);
    if (local_c8[0] != (internal)0x0) goto LAB_0012788e;
    testing::Message::Message((Message *)local_a8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0x1c5,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_a8);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
  if (local_a8 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_a8 + 8))();
  }
LAB_0012788e:
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  if ((_Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
       )local_90.super_Test.gtest_flag_saver_._M_t.
        super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
        ._M_t.
        super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
        .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl !=
      (GTestFlagSaver *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_90.super_Test.gtest_flag_saver_._M_t.
               super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
               ._M_t.
               super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
               .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl);
  }
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
  }
  pstore::file::file_base::~file_base((file_base *)local_60);
  return;
}

Assistant:

TEST_F (MemoryFile, ReadFileWithInitialContents) {
    constexpr std::size_t elements = 11;
    char const source_string[elements + 1]{"Hello World"};
    ASSERT_EQ (elements, std::strlen (source_string))
        << "Expected buffer length to be " << elements;
    pstore::file::in_memory mf (MemoryFile::make_buffer (source_string), elements, elements);

    EXPECT_EQ (0U, mf.tell ()) << "Expected the initial file offset to be 0";
    EXPECT_EQ (elements, mf.size ()) << "Expected the file to be the same size as the string";

    auto out = MemoryFile::make_buffer (elements);
    std::size_t const actual_read = mf.read_buffer (out.get (), elements);
    ASSERT_EQ (elements, actual_read);
    EXPECT_TRUE (std::equal (out.get (), out.get () + elements, source_string));
    EXPECT_EQ (elements, mf.tell ());
}